

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_ALSA.c
# Opt level: O3

void AlsaThread(void *Arg)

{
  int iVar1;
  UINT32 dataSize;
  
  OSSignal_Wait(*(OS_SIGNAL **)((long)Arg + 0x38));
  while (*(char *)((long)Arg + 8) == '\x01') {
    iVar1 = snd_pcm_wait(*(undefined8 *)((long)Arg + 0x48),5);
    if (iVar1 < 0) {
      usleep(1000);
    }
    OSMutex_Lock(*(OS_MUTEX **)((long)Arg + 0x40));
    if ((*(char *)((long)Arg + 0x50) == '\0') &&
       (iVar1 != 0 && *(code **)((long)Arg + 0x60) != (code *)0x0)) {
      dataSize = (**(code **)((long)Arg + 0x60))
                           (*Arg,*(undefined8 *)((long)Arg + 0x58),*(undefined4 *)((long)Arg + 0x20)
                            ,*(undefined8 *)((long)Arg + 0x28));
      WriteBuffer((DRV_ALSA *)Arg,dataSize,*(void **)((long)Arg + 0x28));
    }
    OSMutex_Unlock(*(OS_MUTEX **)((long)Arg + 0x40));
    while (((*(char *)((long)Arg + 0x50) != '\0' || (*(long *)((long)Arg + 0x60) == 0)) &&
           (*(char *)((long)Arg + 8) == '\x01'))) {
      usleep(1000);
    }
  }
  return;
}

Assistant:

static void AlsaThread(void* Arg)
{
	DRV_ALSA* drv = (DRV_ALSA*)Arg;
	UINT32 bufBytes;
	int retVal;
	
	OSSignal_Wait(drv->hSignal);	// wait until the initialization is done
	
	while(drv->devState == 1)
	{
		// return values: 0 - timeout, 1 - ready, <0 - error
		retVal = snd_pcm_wait(drv->hPCM, 5);
		if (retVal < 0)
			Sleep(1);	// only wait a bit on errors
		
		OSMutex_Lock(drv->hMutex);
		if (! drv->pauseThread && drv->FillBuffer != NULL)
		{
			// Note: On errors I try to send some data in order to call recovery functions.
			if (retVal != 0)
			{
				bufBytes = drv->FillBuffer(drv->audDrvPtr, drv->userParam, drv->bufSize, drv->bufSpace);
				retVal = WriteBuffer(drv, bufBytes, drv->bufSpace);
			}
		}
		OSMutex_Unlock(drv->hMutex);
		
		while((drv->pauseThread || drv->FillBuffer == NULL) && drv->devState == 1)
			Sleep(1);
	}
	
	return;
}